

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

char * lua_pushlstring(lua_State *L,char *s,size_t len)

{
  StkId pSVar1;
  TString *pTVar2;
  char **ppcVar3;
  
  if (len == 0) {
    pTVar2 = luaS_new(L,"");
  }
  else {
    pTVar2 = luaS_newlstr(L,s,len);
  }
  pSVar1 = (L->top).p;
  *(TString **)pSVar1 = pTVar2;
  (pSVar1->val).tt_ = pTVar2->tt | 0x40;
  (L->top).p = (StkId)((L->top).offset + 0x10);
  if (L->l_G->GCdebt < 1) {
    luaC_step(L);
  }
  ppcVar3 = &pTVar2->contents;
  if (pTVar2->shrlen < '\0') {
    ppcVar3 = (char **)*ppcVar3;
  }
  return (char *)ppcVar3;
}

Assistant:

LUA_API const char *lua_pushlstring (lua_State *L, const char *s, size_t len) {
  TString *ts;
  lua_lock(L);
  ts = (len == 0) ? luaS_new(L, "") : luaS_newlstr(L, s, len);
  setsvalue2s(L, L->top.p, ts);
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return getstr(ts);
}